

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O2

BOOL __thiscall
Js::DictionaryTypeHandlerBase<int>::SetPropertyWithAttributes
          (DictionaryTypeHandlerBase<int> *this,DynamicObject *instance,PropertyId propertyId,
          Var value,PropertyAttributes attributes,PropertyValueInfo *info,
          PropertyOperationFlags flags,SideEffects possibleSideEffects)

{
  code *pcVar1;
  ScriptContext *pSVar2;
  uint uVar3;
  bool bVar4;
  BOOL BVar5;
  uint32 uVar6;
  int iVar7;
  undefined4 *puVar8;
  PropertyRecord *pPVar9;
  byte bVar10;
  uint uVar11;
  ulong uVar12;
  undefined7 in_register_00000081;
  Var value_00;
  WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_> local_78;
  uint32 local_6c;
  Var pvStack_68;
  uint32 debugIndex;
  Var local_60;
  PropertyRecord *local_58;
  PropertyRecord *propertyRecord;
  ScriptContext *local_48;
  uint local_3c;
  DictionaryPropertyDescriptor<int> *local_38;
  DictionaryPropertyDescriptor<int> *descriptor;
  
  local_3c = (uint)CONCAT71(in_register_00000081,attributes);
  local_48 = (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
             super_JavascriptLibraryBase).scriptContext.ptr;
  propertyRecord = (PropertyRecord *)info;
  if (((flags & PropertyOperation_ThrowIfNotExtensible) != PropertyOperation_None) &&
     (BVar5 = ScriptContext::IsNumericPropertyId(local_48,propertyId,&local_6c), BVar5 != 0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x724,
                                "(!(throwIfNotExtensible && scriptContext->IsNumericPropertyId(propertyId, &debugIndex)))"
                                ,
                                "!(throwIfNotExtensible && scriptContext->IsNumericPropertyId(propertyId, &debugIndex))"
                               );
    if (!bVar4) goto LAB_00c298ff;
    *puVar8 = 0;
  }
  if (propertyId == -1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x726,"(propertyId != Constants::NoProperty)",
                                "propertyId != Constants::NoProperty");
    if (!bVar4) goto LAB_00c298ff;
    *puVar8 = 0;
  }
  local_58 = ScriptContext::GetPropertyName
                       ((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                        super_JavascriptLibraryBase).scriptContext.ptr,propertyId);
  bVar4 = JsUtil::
          BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::TryGetReference<Js::PropertyRecord_const*>
                    ((BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)(this->propertyMap).ptr,&local_58,&local_38);
  uVar3 = local_3c;
  uVar12 = (ulong)(byte)local_3c;
  uVar11 = local_3c & 0xff;
  if (!bVar4) {
    if (local_58->isNumeric == true) {
      uVar6 = PropertyRecord::GetNumericValue(local_58);
      iVar7 = (*(this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x2e])
                        (this,instance,(ulong)uVar6,value,uVar12);
      return iVar7;
    }
    BVar5 = AddProperty(this,instance,local_58,value,(byte)local_3c,
                        (PropertyValueInfo *)propertyRecord,flags,
                        SUB41((flags & PropertyOperation_ThrowIfNotExtensible) >> 2,0),
                        possibleSideEffects);
    return BVar5;
  }
  pvStack_68 = value;
  bVar4 = DictionaryPropertyDescriptor<int>::SanityCheckFixedBits(local_38);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x72b,"(descriptor->SanityCheckFixedBits())",
                                "descriptor->SanityCheckFixedBits()");
    if (!bVar4) goto LAB_00c298ff;
    *puVar8 = 0;
  }
  pSVar2 = local_48;
  bVar10 = local_38->Attributes;
  if ((uVar3 & 0x10 & (uint)bVar10) == 0) {
    if (((uVar3 & 0x10) == 0) && ((bVar10 & 8) != 0)) {
      if (((flags & PropertyOperation_Force) == PropertyOperation_None) &&
         (bVar4 = DynamicTypeHandler::VerifyIsExtensible
                            (&this->super_DynamicTypeHandler,local_48,
                             SUB41((flags & PropertyOperation_ThrowIfNotExtensible) >> 2,0)), !bVar4
         )) {
        return 0;
      }
      ScriptContext::InvalidateProtoCaches(pSVar2,propertyId);
      local_38->Attributes =
           (char)(local_38->Attributes * '\b') >> 7 & local_38->Attributes & 0xd0 | (byte)local_3c;
      DictionaryPropertyDescriptor<int>::ConvertToData(local_38);
      goto LAB_00c29620;
    }
    if ((local_38->flags & IsShadowed) != None) {
      bVar10 = bVar10 & 0xd0;
LAB_00c298d4:
      local_38->Attributes = bVar10 | (byte)local_3c;
      goto LAB_00c29521;
    }
    if ((uVar3 & 0x10) == (bVar10 & 0x10)) {
      if ((local_38->flags & IsAccessor) != None && (uVar3 & 0x10) == 0) {
        local_60 = JavascriptOperators::GetProperty
                             (&instance->super_RecyclableObject,0x67,local_48,
                              (PropertyValueInfo *)0x0);
        if (((((instance->super_RecyclableObject).type.ptr)->typeId & ~TypeIds_Null) !=
             TypeIds_GlobalObject) &&
           (bVar4 = JavascriptFunction::IsBuiltinProperty(instance,(PropertyIds)propertyId), !bVar4)
           ) {
          BVar5 = JavascriptOperators::IsClassConstructor(instance);
          if ((BVar5 == 0) &&
             (BVar5 = JavascriptOperators::IsClassConstructor(local_60), BVar5 == 0)) {
            BVar5 = JavascriptOperators::IsClassMethod(local_60);
            if (((~uVar11 & 6) != 0) || (BVar5 == 0)) {
LAB_00c29745:
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
              *puVar8 = 1;
              bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                          ,0x78a,
                                          "(VarIs<RootObjectBase>(instance) || JavascriptFunction::IsBuiltinProperty(instance, propertyId) || ((JavascriptOperators::IsClassConstructor(instance) || JavascriptOperators::IsClassConstructor(ctor) || JavascriptOperators::IsClassMethod(ctor)) && (attributes & (0x02|0x04)) == (0x02|0x04)))"
                                          ,
                                          "Expect to only come down this path for InitClassMember or InitRootFld (on the global object) overwriting existing accessor property"
                                         );
              if (!bVar4) {
LAB_00c298ff:
                pcVar1 = (code *)invalidInstructionException();
                (*pcVar1)();
              }
              *puVar8 = 0;
            }
          }
          else if ((~uVar11 & 6) != 0) goto LAB_00c29745;
        }
        pSVar2 = local_48;
        if ((local_38->Attributes & 2) == 0) {
          if (local_48 == (ScriptContext *)0x0) {
            return 0;
          }
          bVar4 = ThreadContext::RecordImplicitException(local_48->threadContext);
          if (!bVar4) {
            return 0;
          }
          pPVar9 = ThreadContext::GetPropertyName(pSVar2->threadContext,propertyId);
          JavascriptError::ThrowTypeError(pSVar2,-0x7ff5ec2a,(PCWSTR)(pPVar9 + 1));
        }
        DictionaryPropertyDescriptor<int>::ConvertToData(local_38);
        DynamicObject::ChangeType(instance);
        bVar10 = local_38->Attributes;
      }
      bVar10 = bVar10 & 0x10;
      goto LAB_00c298d4;
    }
    iVar7 = (this->super_DynamicTypeHandler).slotCapacity;
    if (iVar7 <= this->nextPropertyIndex) {
      if (0x3ffffffe < iVar7) {
        Throw::OutOfMemory();
      }
      EnsureSlotCapacity(this,instance,1);
    }
    bVar4 = (uVar3 & 0x10) != 0;
    bVar10 = local_38->Attributes & 0xc0 | (byte)local_3c;
    if (bVar4) {
      bVar10 = (byte)local_3c & 0xc0 | local_38->Attributes;
    }
    local_38->Attributes = bVar10;
    DictionaryPropertyDescriptor<int>::AddShadowedData(local_38,&this->nextPropertyIndex,bVar4);
    if ((this->super_DynamicTypeHandler).slotCapacity < this->nextPropertyIndex) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                  ,0x765,"(this->GetSlotCapacity() >= nextPropertyIndex)",
                                  "this->GetSlotCapacity() >= nextPropertyIndex");
      if (!bVar4) goto LAB_00c298ff;
      *puVar8 = 0;
    }
    if ((uVar3 & 0x10) == 0) goto LAB_00c29620;
    DynamicObject::ChangeType(instance);
  }
  else {
LAB_00c29521:
    if ((uVar3 & 0x10) == 0) {
LAB_00c29620:
      value_00 = pvStack_68;
      SetPropertyWithDescriptor<false>
                (this,instance,local_58,&local_38,pvStack_68,flags,
                 (PropertyValueInfo *)propertyRecord);
      goto LAB_00c29646;
    }
  }
  value_00 = pvStack_68;
  SetPropertyWithDescriptor<true>
            (this,instance,local_58,&local_38,pvStack_68,flags,(PropertyValueInfo *)propertyRecord);
LAB_00c29646:
  if (local_38 != (DictionaryPropertyDescriptor<int> *)0x0) {
    if ((local_38->Attributes & 1) != 0) {
      DynamicObject::SetHasNoEnumerableProperties(instance,false);
    }
    Memory::WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>::
    WriteBarrierSet(&local_78,
                    &((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                     typesWithOnlyWritablePropertyProtoChain);
    PrototypeChainCache<Js::OnlyWritablePropertyCache>::ProcessProperty<int>
              (local_78.ptr,&this->super_DynamicTypeHandler,local_38->Attributes,propertyId,local_48
              );
  }
  DynamicTypeHandler::SetPropertyUpdateSideEffect
            (&this->super_DynamicTypeHandler,instance,propertyId,value_00,possibleSideEffects);
  return 1;
}

Assistant:

BOOL DictionaryTypeHandlerBase<T>::SetPropertyWithAttributes(DynamicObject* instance, PropertyId propertyId, Var value,
        PropertyAttributes attributes, PropertyValueInfo* info, PropertyOperationFlags flags, SideEffects possibleSideEffects)
    {
        DictionaryPropertyDescriptor<T>* descriptor;
        ScriptContext* scriptContext = instance->GetScriptContext();
        bool isForce = (flags & PropertyOperation_Force) != 0;
        bool throwIfNotExtensible = (flags & PropertyOperation_ThrowIfNotExtensible) != 0;

#ifdef DEBUG
        uint32 debugIndex;
        Assert(!(throwIfNotExtensible && scriptContext->IsNumericPropertyId(propertyId, &debugIndex)));
#endif
        Assert(propertyId != Constants::NoProperty);
        PropertyRecord const* propertyRecord = instance->GetScriptContext()->GetPropertyName(propertyId);
        if (propertyMap->TryGetReference(propertyRecord, &descriptor))
        {
#if ENABLE_FIXED_FIELDS
            Assert(descriptor->SanityCheckFixedBits());
#endif
            if (attributes & descriptor->Attributes & PropertyLetConstGlobal)
            {
                // Do not need to change the descriptor or its attributes if setting the initial value of a LetConstGlobal
            }
            else if (descriptor->Attributes & PropertyDeleted && !(attributes & PropertyLetConstGlobal))
            {
                if (!isForce)
                {
                    if (!this->VerifyIsExtensible(scriptContext, throwIfNotExtensible))
                    {
                        return FALSE;
                    }
                }

                scriptContext->InvalidateProtoCaches(propertyId);
                if (descriptor->Attributes & PropertyLetConstGlobal)
                {
                    descriptor->Attributes = attributes | (descriptor->Attributes & (PropertyLetConstGlobal | PropertyNoRedecl));
                }
                else
                {
                    descriptor->Attributes = attributes;
                }
                descriptor->ConvertToData();
            }
            else if (descriptor->GetIsShadowed())
            {
                descriptor->Attributes = attributes | (descriptor->Attributes & (PropertyLetConstGlobal | PropertyNoRedecl));
            }
            else if ((descriptor->Attributes & PropertyLetConstGlobal) != (attributes & PropertyLetConstGlobal))
            {
                // We could potentially need 1 new slot by AddShadowedData(), try pre-reserve
                if (this->GetSlotCapacity() <= nextPropertyIndex)
                {
                    if (this->GetSlotCapacity() >= MaxPropertyIndexSize)
                    {
                        return ConvertToBigDictionaryTypeHandler(instance)->SetPropertyWithAttributes(
                            instance, propertyId, value, attributes, info, flags, possibleSideEffects);
                    }

                    this->EnsureSlotCapacity(instance);
                }

                bool addingLetConstGlobal = (attributes & PropertyLetConstGlobal) != 0;

                if (addingLetConstGlobal)
                {
                    descriptor->Attributes = descriptor->Attributes | (attributes & PropertyNoRedecl);
                }
                else
                {
                    descriptor->Attributes = attributes | (descriptor->Attributes & PropertyNoRedecl);
                }

                descriptor->AddShadowedData(nextPropertyIndex, addingLetConstGlobal);

                AssertOrFailFast(this->GetSlotCapacity() >= nextPropertyIndex); // pre-reserved above

                if (addingLetConstGlobal)
                {
                    // If shadowing a global property with a let/const, need to invalidate
                    // JIT fast path cache since look up could now go to the let/const instead
                    // of the global property.
                    //
                    // Do not need to invalidate when adding a global property that gets shadowed
                    // by an existing let/const, since all caches will still be correct.
                    instance->ChangeType();
                }
            }
            else
            {
                if (descriptor->GetIsAccessor() && !(attributes & PropertyLetConstGlobal))
                {
#if DEBUG
                    Var ctor = JavascriptOperators::GetProperty(instance, PropertyIds::constructor, scriptContext);
#endif
                    AssertMsg(VarIs<RootObjectBase>(instance) || JavascriptFunction::IsBuiltinProperty(instance, propertyId) ||
                        // ValidateAndApplyPropertyDescriptor says to preserve Configurable and Enumerable flags

                        // For InitRootFld, which is equivalent to
                        // CreateGlobalFunctionBinding called from GlobalDeclarationInstantiation in the spec,
                        // we can assume that the attributes specified include enumerable and writable.  Thus
                        // we don't need to preserve the original values of these two attributes and therefore
                        // do not need to change InitRootFld from being a SetPropertyWithAttributes API call to
                        // something else.  All we need to do is convert the descriptor to a data descriptor.
                        // Built-in Function.prototype properties 'length', 'arguments', and 'caller' are special cases.

                        ((JavascriptOperators::IsClassConstructor(instance) // Static method
                            || JavascriptOperators::IsClassConstructor(ctor)
                            || JavascriptOperators::IsClassMethod(ctor))
                            && (attributes & PropertyClassMemberDefaults) == PropertyClassMemberDefaults),
                        // 14.3.9: InitClassMember sets property descriptor to {writable:true, enumerable:false, configurable:true}

                        "Expect to only come down this path for InitClassMember or InitRootFld (on the global object) overwriting existing accessor property");
                    if (!(descriptor->Attributes & PropertyConfigurable))
                    {
                        if (scriptContext && scriptContext->GetThreadContext()->RecordImplicitException())
                        {
                            JavascriptError::ThrowTypeError(scriptContext, JSERR_DefineProperty_NotConfigurable, scriptContext->GetThreadContext()->GetPropertyName(propertyId)->GetBuffer());
                        }
                        return FALSE;
                    }
                    descriptor->ConvertToData();
                    instance->ChangeType();
                }

                // Make sure to keep the PropertyLetConstGlobal bit as is while taking the new attributes.
                descriptor->Attributes = attributes | (descriptor->Attributes & PropertyLetConstGlobal);
            }

            if (attributes & PropertyLetConstGlobal)
            {
                SetPropertyWithDescriptor<true>(instance, propertyRecord, &descriptor, value, flags, info);
            }
            else
            {
                SetPropertyWithDescriptor<false>(instance, propertyRecord, &descriptor, value, flags, info);
            }
            if (descriptor != nullptr)  //descriptor can dissappear, so this reference may not exist.
            {
                if (descriptor->Attributes & PropertyEnumerable)
                {
                    instance->SetHasNoEnumerableProperties(false);
                }
                instance->GetLibrary()->GetTypesWithOnlyWritablePropertyProtoChainCache()->ProcessProperty(this, descriptor->Attributes, propertyId, scriptContext);
            }

            SetPropertyUpdateSideEffect(instance, propertyId, value, possibleSideEffects);
            return true;
        }

        // Always check numeric propertyRecord. This may create objectArray.
        if (propertyRecord->IsNumeric())
        {
            // Calls this or subclass implementation
            return SetItemWithAttributes(instance, propertyRecord->GetNumericValue(), value, attributes);
        }

        return this->AddProperty(instance, propertyRecord, value, attributes, info, flags, throwIfNotExtensible, possibleSideEffects);
    }